

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.h
# Opt level: O0

regex_stack_var * __thiscall CRegexStack::new_reg_or_var(CRegexStack *this,int id)

{
  regex_stack_var *prVar1;
  int in_ESI;
  CRegexStack *in_RDI;
  regex_stack_var *var;
  regex_stack_entry *fp;
  int *local_28;
  
  local_28 = (int *)(in_RDI->buf_ + (long)in_RDI->sp_ + 0x24);
  while( true ) {
    if (in_RDI->buf_ + in_RDI->used_ <= local_28) {
      prVar1 = (regex_stack_var *)alloc_space(in_RDI,0xc);
      prVar1->id = in_ESI;
      return prVar1;
    }
    if (*local_28 == in_ESI) break;
    local_28 = local_28 + 3;
  }
  return (regex_stack_var *)0x0;
}

Assistant:

regex_stack_var *new_reg_or_var(int id)
    {
        /* get the stack pointer */
        regex_stack_entry *fp = (regex_stack_entry *)(buf_ + sp_);

        /* scan the frame for a register/variable with this ID */
        regex_stack_var *var;
        for (var = (regex_stack_var *)(fp + 1) ;
             var < (regex_stack_var *)(buf_ + used_) ; ++var)
        {
            /* if this is the one, we don't need to save it again */
            if (var->id == id)
                return 0;
        }

        /* we didn't find it, so return a new entry with the given ID */
        var = (regex_stack_var *)alloc_space(sizeof(regex_stack_var));
        var->id = id;
        return var;
    }